

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# init.c
# Opt level: O0

parser_error parse_world_level(parser *p)

{
  level *plVar1;
  wchar_t wVar2;
  int iVar3;
  char *pcVar4;
  char *__s1;
  char *__s1_00;
  void *pvVar5;
  level *v;
  char *local_50;
  char *local_48;
  level_conflict *lev;
  level_conflict *last;
  char *down;
  char *up;
  char *name;
  wchar_t depth;
  parser *p_local;
  
  wVar2 = parser_getint(p,"depth");
  pcVar4 = parser_getsym(p,"name");
  __s1 = parser_getsym(p,"up");
  __s1_00 = parser_getsym(p,"down");
  pvVar5 = parser_priv(p);
  v = (level *)mem_zalloc(0x28);
  plVar1 = v;
  if (pvVar5 != (void *)0x0) {
    *(level **)((long)pvVar5 + 0x20) = v;
    plVar1 = world;
  }
  world = plVar1;
  v->depth = wVar2;
  pcVar4 = string_make(pcVar4);
  v->name = pcVar4;
  iVar3 = strcmp(__s1,"None");
  if (iVar3 == 0) {
    local_48 = (char *)0x0;
  }
  else {
    local_48 = string_make(__s1);
  }
  v->up = local_48;
  iVar3 = strcmp(__s1_00,"None");
  if (iVar3 == 0) {
    local_50 = (char *)0x0;
  }
  else {
    local_50 = string_make(__s1_00);
  }
  v->down = local_50;
  parser_setpriv(p,v);
  return PARSE_ERROR_NONE;
}

Assistant:

static enum parser_error parse_world_level(struct parser *p) {
	const int depth = parser_getint(p, "depth");
	const char *name = parser_getsym(p, "name");
	const char *up = parser_getsym(p, "up");
	const char *down = parser_getsym(p, "down");
	struct level *last = parser_priv(p);
	struct level *lev = mem_zalloc(sizeof *lev);

	if (last) {
		last->next = lev;
	} else {
		world = lev;
	}
	lev->depth = depth;
	lev->name = string_make(name);
	lev->up = streq(up, "None") ? NULL : string_make(up);
	lev->down = streq(down, "None") ? NULL : string_make(down);
	parser_setpriv(p, lev);
	return PARSE_ERROR_NONE;
}